

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O3

int float128_is_quiet_nan_mips64(float128 a,float_status *status)

{
  bool bVar1;
  ulong uVar2;
  
  if (status->snan_bit_is_one == '\0') {
    if ((a.high._4_4_ >> 0xf & 0xffff) < 0xffff) goto LAB_00863353;
    uVar2 = 0xffffffffffff;
  }
  else {
    if ((a.high & 0x7fff800000000000) != 0x7fff000000000000) {
LAB_00863353:
      bVar1 = false;
      goto LAB_00863355;
    }
    uVar2 = 0x7fffffffffff;
  }
  bVar1 = a.low != 0 || (a.high & uVar2) != 0;
LAB_00863355:
  return (int)bVar1;
}

Assistant:

int float128_is_quiet_nan(float128 a, float_status *status)
{
#ifdef NO_SIGNALING_NANS
    return float128_is_any_nan(a);
#else
    if (snan_bit_is_one(status)) {
        return (((a.high >> 47) & 0xFFFF) == 0xFFFE)
            && (a.low || (a.high & 0x00007FFFFFFFFFFFULL));
    } else {
        return ((a.high << 1) >= 0xFFFF000000000000ULL)
            && (a.low || (a.high & 0x0000FFFFFFFFFFFFULL));
    }
#endif
}